

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

void __thiscall
EnvironmentROBARM::ContXY2Cell
          (EnvironmentROBARM *this,double x,double y,unsigned_short *pX,unsigned_short *pY)

{
  unsigned_short *pY_local;
  unsigned_short *pX_local;
  double y_local;
  double x_local;
  EnvironmentROBARM *this_local;
  
  *pX = (unsigned_short)(int)(x / (this->EnvROBARMCfg).GridCellWidth);
  if (x < 0.0) {
    *pX = 0;
  }
  if ((this->EnvROBARMCfg).EnvWidth_c <= (int)(uint)*pX) {
    *pX = (short)(this->EnvROBARMCfg).EnvWidth_c - 1;
  }
  *pY = (unsigned_short)(int)(y / (this->EnvROBARMCfg).GridCellWidth);
  if (y < 0.0) {
    *pY = 0;
  }
  if ((this->EnvROBARMCfg).EnvHeight_c <= (int)(uint)*pY) {
    *pY = (short)(this->EnvROBARMCfg).EnvHeight_c - 1;
  }
  return;
}

Assistant:

void EnvironmentROBARM::ContXY2Cell(double x, double y, short unsigned int* pX, short unsigned int *pY)
{
    //take the nearest cell
    *pX = (int)(x / EnvROBARMCfg.GridCellWidth);
    if (x < 0) *pX = 0;
    if (*pX >= EnvROBARMCfg.EnvWidth_c) *pX = EnvROBARMCfg.EnvWidth_c - 1;

    *pY = (int)(y / EnvROBARMCfg.GridCellWidth);
    if (y < 0) *pY = 0;
    if (*pY >= EnvROBARMCfg.EnvHeight_c) *pY = EnvROBARMCfg.EnvHeight_c - 1;
}